

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  undefined1 local_60 [8];
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *ctx_local;
  
  ini_handler.UserData = ctx;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)local_60);
  local_60 = (undefined1  [8])0x1e3304;
  ini_handler.TypeName._0_4_ = ImHashStr("Docking",0,0);
  ini_handler._8_8_ = DockSettingsHandler_ClearAll;
  ini_handler.ClearAllFn = DockSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = DockSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = DockSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = DockSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = DockSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x2fd0),
             (ImGuiSettingsHandler *)local_60);
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ClearAllFn = DockSettingsHandler_ClearAll;
    ini_handler.ReadInitFn = DockSettingsHandler_ClearAll; // Also clear on read
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = DockSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}